

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly.c
# Opt level: O2

int pair1poly_set_max_ttl(void *arg,void *buf,size_t sz,nni_opt_type t)

{
  int iVar1;
  int local_1c [2];
  int ttl;
  
  iVar1 = nni_copyin_int(local_1c,buf,sz,1,0xf,t);
  if (iVar1 == 0) {
    nni_atomic_set((nni_atomic_int *)((long)arg + 0x18),local_1c[0]);
  }
  return iVar1;
}

Assistant:

static int
pair1poly_set_max_ttl(void *arg, const void *buf, size_t sz, nni_opt_type t)
{
	pair1poly_sock *s = arg;
	int             rv;
	int             ttl;

	if ((rv = nni_copyin_int(&ttl, buf, sz, 1, NNI_MAX_MAX_TTL, t)) == 0) {
		nni_atomic_set(&s->ttl, ttl);
	}

	return (rv);
}